

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O3

void xmlParserValidityWarning(void *ctx,char *msg,...)

{
  xmlGenericErrorFunc p_Var1;
  char in_AL;
  int iVar2;
  int iVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  char *pcVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar7;
  uint uVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  char *__s;
  bool bVar9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  xmlParserInputPtr local_118;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar2 = xmlStrlen((xmlChar *)msg);
  if ((iVar2 == 0 || ctx == (void *)0x0) || (msg[(long)iVar2 + -1] == ':')) {
    local_118 = (xmlParserInputPtr)0x0;
  }
  else {
    local_118 = *(xmlParserInputPtr *)((long)ctx + 0x38);
    if ((local_118->filename == (char *)0x0) && (1 < (long)*(int *)((long)ctx + 0x40))) {
      local_118 = *(xmlParserInputPtr *)
                   (*(long *)((long)ctx + 0x48) + -0x10 + (long)*(int *)((long)ctx + 0x40) * 8);
    }
    xmlParserPrintFileInfo(local_118);
  }
  pp_Var4 = __xmlGenericError();
  p_Var1 = *pp_Var4;
  ppvVar5 = __xmlGenericErrorContext();
  __s = (char *)0x0;
  (*p_Var1)(*ppvVar5,"validity warning: ");
  pcVar6 = (char *)(*xmlMalloc)(0x96);
  if (pcVar6 != (char *)0x0) {
    iVar2 = -1;
    uVar8 = 0x96;
    do {
      __s = pcVar6;
      if (63999 < (int)uVar8) break;
      local_f8 = local_e8;
      local_100 = &stack0x00000008;
      local_108 = 0x3000000010;
      iVar3 = vsnprintf(__s,(ulong)uVar8,msg,&local_108);
      if ((iVar3 < (int)uVar8 && -1 < iVar3) && (bVar9 = iVar2 == iVar3, iVar2 = iVar3, bVar9))
      break;
      iVar7 = iVar3 + 1;
      if (iVar3 < 0) {
        iVar7 = 100;
      }
      uVar8 = iVar7 + uVar8;
      pcVar6 = (char *)(*xmlRealloc)(__s,(ulong)uVar8);
    } while (pcVar6 != (char *)0x0);
  }
  pp_Var4 = __xmlGenericError();
  p_Var1 = *pp_Var4;
  ppvVar5 = __xmlGenericErrorContext();
  (*p_Var1)(*ppvVar5,"%s",__s);
  if (__s != (char *)0x0) {
    (*xmlFree)(__s);
  }
  if (ctx != (void *)0x0) {
    xmlParserPrintFileContext(local_118);
  }
  return;
}

Assistant:

void XMLCDECL
xmlParserValidityWarning(void *ctx, const char *msg, ...)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlParserInputPtr input = NULL;
    char * str;
    int len = xmlStrlen((const xmlChar *) msg);

    if ((ctxt != NULL) && (len != 0) && (msg[len - 1] != ':')) {
	input = ctxt->input;
	if ((input->filename == NULL) && (ctxt->inputNr > 1))
	    input = ctxt->inputTab[ctxt->inputNr - 2];

	xmlParserPrintFileInfo(input);
    }

    xmlGenericError(xmlGenericErrorContext, "validity warning: ");
    XML_GET_VAR_STR(msg, str);
    xmlGenericError(xmlGenericErrorContext, "%s", str);
    if (str != NULL)
	xmlFree(str);

    if (ctxt != NULL) {
	xmlParserPrintFileContext(input);
    }
}